

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O3

char * ngx_http_log_compile_format
                 (ngx_conf_t *cf,ngx_array_t *flushes,ngx_array_t *ops,ngx_array_t *args,
                 ngx_uint_t s)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  void *pvVar4;
  ulong uVar5;
  ngx_http_log_op_run_pt p_Var6;
  int iVar7;
  size_t *psVar8;
  void *__dest;
  size_t sVar9;
  size_t sVar10;
  size_t *psVar11;
  char *pcVar12;
  code *pcVar13;
  code *pcVar14;
  ulong uVar15;
  ulong uVar16;
  ngx_str_t *__s1;
  ulong *puVar17;
  u_char *__s2;
  ulong uVar18;
  ulong uVar19;
  ngx_http_log_var_t *pnVar20;
  ulong uVar21;
  ngx_uint_t nVar22;
  bool bVar23;
  ngx_str_t local_58;
  ulong local_48;
  ulong *local_40;
  ngx_conf_t *local_38;
  
  pvVar4 = args->elts;
  nVar22 = args->nelts;
  bVar23 = true;
  local_38 = cf;
  if (s < nVar22) {
    pcVar12 = *(char **)((long)pvVar4 + s * 0x10 + 8);
    iVar7 = strncmp(pcVar12,"escape=",7);
    if (iVar7 == 0) {
      __s1 = (ngx_str_t *)(pcVar12 + 7);
      iVar7 = strcmp((char *)__s1,"json");
      bVar23 = iVar7 != 0;
      if ((bVar23) && (iVar7 = strcmp((char *)__s1,"default"), iVar7 != 0)) {
        pcVar12 = "unknown log format escaping \"%s\"";
LAB_0014675d:
        ngx_conf_log_error(1,local_38,0,pcVar12,__s1);
        return (char *)0xffffffffffffffff;
      }
      s = s + 1;
    }
  }
  if (nVar22 <= s) {
    return (char *)0x0;
  }
  pcVar13 = ngx_http_log_json_variable_getlen;
  if (bVar23) {
    pcVar13 = ngx_http_log_variable_getlen;
  }
  pcVar14 = ngx_http_log_json_variable;
  local_48 = s;
  if (bVar23) {
    pcVar14 = ngx_http_log_variable;
  }
  do {
    if (*(long *)((long)pvVar4 + local_48 * 0x10) != 0) {
      puVar17 = (ulong *)(local_48 * 0x10 + (long)pvVar4);
      uVar18 = 0;
      local_40 = puVar17;
      do {
        psVar8 = (size_t *)ngx_array_push(ops);
        if (psVar8 == (size_t *)0x0) {
          return (char *)0xffffffffffffffff;
        }
        uVar5 = puVar17[1];
        __s1 = (ngx_str_t *)(uVar5 + uVar18);
        if (*(char *)(uVar5 + uVar18) == '$') {
          uVar19 = uVar18 + 1;
          uVar21 = *puVar17;
          if ((uVar19 != uVar21) &&
             ((cVar2 = *(char *)(uVar5 + uVar19), cVar2 != '{' ||
              (uVar19 = uVar18 + 2, uVar19 != uVar21)))) {
            __s2 = (u_char *)(uVar5 + uVar19);
            local_58.len = 0;
            for (; sVar10 = local_58.len, local_58.data = __s2, uVar19 < uVar21; uVar19 = uVar19 + 1
                ) {
              bVar3 = *(byte *)(uVar5 + uVar19);
              if ((cVar2 == '{') && (bVar3 == 0x7d)) {
                uVar19 = uVar19 + 1;
                goto LAB_0014665a;
              }
              if ((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) &&
                 (bVar3 != 0x5f && 9 < (byte)(bVar3 - 0x30))) break;
              local_58.len = local_58.len + 1;
            }
            if (cVar2 == '{') {
              pcVar12 = "the closing bracket in \"%V\" variable is missing";
              __s1 = &local_58;
              goto LAB_0014675d;
            }
LAB_0014665a:
            if (local_58.len != 0) {
              sVar9 = 4;
              pnVar20 = ngx_http_log_vars;
              do {
                pnVar20 = pnVar20 + 1;
                if ((sVar9 == sVar10) &&
                   (iVar7 = strncmp((char *)pnVar20[-1].name.data,(char *)__s2,sVar10), iVar7 == 0))
                {
                  p_Var6 = pnVar20[-1].run;
                  *psVar8 = pnVar20[-1].len;
                  psVar8[1] = 0;
                  psVar8[2] = (size_t)p_Var6;
                  psVar8[3] = 0;
                  puVar17 = local_40;
                  goto LAB_0014670a;
                }
                sVar9 = (pnVar20->name).len;
              } while (sVar9 != 0);
              sVar10 = ngx_http_get_variable_index(local_38,&local_58);
              if (sVar10 == 0xffffffffffffffff) {
                return (char *)0xffffffffffffffff;
              }
              *psVar8 = 0;
              psVar8[1] = (size_t)pcVar13;
              psVar8[2] = (size_t)pcVar14;
              psVar8[3] = sVar10;
              puVar17 = local_40;
              if (flushes != (ngx_array_t *)0x0) {
                psVar11 = (size_t *)ngx_array_push(flushes);
                if (psVar11 == (size_t *)0x0) {
                  return (char *)0xffffffffffffffff;
                }
                *psVar11 = psVar8[3];
                puVar17 = local_40;
              }
              goto LAB_0014670a;
            }
          }
          pcVar12 = "invalid parameter \"%s\"";
          goto LAB_0014675d;
        }
        uVar21 = *puVar17;
        uVar16 = uVar18;
        uVar15 = uVar18 + 1;
        if (uVar18 + 1 < uVar21) {
          uVar15 = uVar21;
        }
        do {
          uVar1 = uVar16 + 1;
          uVar19 = uVar15;
          if (uVar21 <= uVar1) break;
          pcVar12 = (char *)(uVar5 + 1 + uVar16);
          uVar19 = uVar1;
          uVar16 = uVar1;
        } while (*pcVar12 != '$');
        uVar21 = uVar19 - uVar18;
        if (uVar21 != 0) {
          *psVar8 = uVar21;
          psVar8[1] = 0;
          if (uVar21 < 9) {
            psVar8[2] = (size_t)ngx_http_log_copy_short;
            psVar8[3] = 0;
            uVar16 = 0;
            uVar21 = uVar19;
            do {
              psVar8[3] = uVar16 << 8;
              uVar16 = uVar16 << 8 | (ulong)*(byte *)((uVar5 - 1) + uVar21);
              psVar8[3] = uVar16;
              uVar21 = uVar21 - 1;
            } while (uVar18 != uVar21);
          }
          else {
            psVar8[2] = (size_t)ngx_http_log_copy_long;
            __dest = ngx_pnalloc(local_38->pool,uVar21);
            if (__dest == (void *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            memcpy(__dest,__s1,uVar21);
            psVar8[3] = (size_t)__dest;
            puVar17 = local_40;
          }
        }
LAB_0014670a:
        uVar18 = uVar19;
      } while (uVar19 < *puVar17);
      nVar22 = args->nelts;
    }
    local_48 = local_48 + 1;
    if (nVar22 <= local_48) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static char *
ngx_http_log_compile_format(ngx_conf_t *cf, ngx_array_t *flushes,
    ngx_array_t *ops, ngx_array_t *args, ngx_uint_t s)
{
    u_char              *data, *p, ch;
    size_t               i, len;
    ngx_str_t           *value, var;
    ngx_int_t           *flush;
    ngx_uint_t           bracket, json;
    ngx_http_log_op_t   *op;
    ngx_http_log_var_t  *v;

    json = 0;
    value = args->elts;

    if (s < args->nelts && ngx_strncmp(value[s].data, "escape=", 7) == 0) {
        data = value[s].data + 7;

        if (ngx_strcmp(data, "json") == 0) {
            json = 1;

        } else if (ngx_strcmp(data, "default") != 0) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "unknown log format escaping \"%s\"", data);
            return NGX_CONF_ERROR;
        }

        s++;
    }

    for ( /* void */ ; s < args->nelts; s++) {

        i = 0;

        while (i < value[s].len) {

            op = ngx_array_push(ops);
            if (op == NULL) {
                return NGX_CONF_ERROR;
            }

            data = &value[s].data[i];

            if (value[s].data[i] == '$') {

                if (++i == value[s].len) {
                    goto invalid;
                }

                if (value[s].data[i] == '{') {
                    bracket = 1;

                    if (++i == value[s].len) {
                        goto invalid;
                    }

                    var.data = &value[s].data[i];

                } else {
                    bracket = 0;
                    var.data = &value[s].data[i];
                }

                for (var.len = 0; i < value[s].len; i++, var.len++) {
                    ch = value[s].data[i];

                    if (ch == '}' && bracket) {
                        i++;
                        bracket = 0;
                        break;
                    }

                    if ((ch >= 'A' && ch <= 'Z')
                        || (ch >= 'a' && ch <= 'z')
                        || (ch >= '0' && ch <= '9')
                        || ch == '_')
                    {
                        continue;
                    }

                    break;
                }

                if (bracket) {
                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                       "the closing bracket in \"%V\" "
                                       "variable is missing", &var);
                    return NGX_CONF_ERROR;
                }

                if (var.len == 0) {
                    goto invalid;
                }

                for (v = ngx_http_log_vars; v->name.len; v++) {

                    if (v->name.len == var.len
                        && ngx_strncmp(v->name.data, var.data, var.len) == 0)
                    {
                        op->len = v->len;
                        op->getlen = NULL;
                        op->run = v->run;
                        op->data = 0;

                        goto found;
                    }
                }

                if (ngx_http_log_variable_compile(cf, op, &var, json)
                    != NGX_OK)
                {
                    return NGX_CONF_ERROR;
                }

                if (flushes) {

                    flush = ngx_array_push(flushes);
                    if (flush == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    *flush = op->data; /* variable index */
                }

            found:

                continue;
            }

            i++;

            while (i < value[s].len && value[s].data[i] != '$') {
                i++;
            }

            len = &value[s].data[i] - data;

            if (len) {

                op->len = len;
                op->getlen = NULL;

                if (len <= sizeof(uintptr_t)) {
                    op->run = ngx_http_log_copy_short;
                    op->data = 0;

                    while (len--) {
                        op->data <<= 8;
                        op->data |= data[len];
                    }

                } else {
                    op->run = ngx_http_log_copy_long;

                    p = ngx_pnalloc(cf->pool, len);
                    if (p == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    ngx_memcpy(p, data, len);
                    op->data = (uintptr_t) p;
                }
            }
        }
    }

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid parameter \"%s\"", data);

    return NGX_CONF_ERROR;
}